

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_manual_::run(Test_intlog_log10floor_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  enable_if_t<(std::is_unsigned_v<unsigned_char>_&&_10UL_>__2___unsigned_char> local_145;
  uint local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_c0;
  enable_if_t<isStringifieable<unsigned_char>,_std::string> local_a0;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  char *local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *local_38;
  char *pcStack_30;
  undefined8 local_28;
  char *local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  local_145 = logFloor<10ul,unsigned_char>('\t');
  local_144 = 0;
  if (local_145 != '\0') {
    stringify<unsigned_char>(&local_a0,&local_145);
    std::operator+(&local_120,
                   "Comparison failed: log10floor<std::uint8_t>(9u) == 0u (with \"log10floor<std::uint8_t>(9u)\"="
                   ,&local_a0);
    std::operator+(&local_100,&local_120,", \"0u\"=");
    stringify<unsigned_int>(&local_c0,&local_144);
    std::operator+(&local_e0,&local_100,&local_c0);
    std::operator+(&local_140,&local_e0,")");
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_18 = "run";
    local_10 = 0x65;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc.line = 0x65;
    msg._M_str = local_140._M_dataplus._M_p;
    msg._M_len = local_140._M_string_length;
    assertFail(msg,loc);
  }
  local_145 = logFloor<10ul,unsigned_char>('\n');
  local_144 = 1;
  if (local_145 != '\x01') {
    stringify<unsigned_char>(&local_a0,&local_145);
    std::operator+(&local_120,
                   "Comparison failed: log10floor<std::uint8_t>(10u) == 1u (with \"log10floor<std::uint8_t>(10u)\"="
                   ,&local_a0);
    std::operator+(&local_100,&local_120,", \"1u\"=");
    stringify<unsigned_int>(&local_c0,&local_144);
    std::operator+(&local_e0,&local_100,&local_c0);
    std::operator+(&local_140,&local_e0,")");
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_30 = "run";
    local_28 = 0x66;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_00.line = 0x66;
    msg_00._M_str = local_140._M_dataplus._M_p;
    msg_00._M_len = local_140._M_string_length;
    assertFail(msg_00,loc_00);
  }
  local_145 = logFloor<10ul,unsigned_char>('c');
  local_144 = 1;
  if (local_145 != '\x01') {
    stringify<unsigned_char>(&local_a0,&local_145);
    std::operator+(&local_120,
                   "Comparison failed: log10floor<std::uint8_t>(99u) == 1u (with \"log10floor<std::uint8_t>(99u)\"="
                   ,&local_a0);
    std::operator+(&local_100,&local_120,", \"1u\"=");
    stringify<unsigned_int>(&local_c0,&local_144);
    std::operator+(&local_e0,&local_100,&local_c0);
    std::operator+(&local_140,&local_e0,")");
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_48 = "run";
    local_40 = 0x67;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_01.line = 0x67;
    msg_01._M_str = local_140._M_dataplus._M_p;
    msg_01._M_len = local_140._M_string_length;
    assertFail(msg_01,loc_01);
  }
  local_145 = logFloor<10ul,unsigned_char>('d');
  local_144 = 2;
  if (local_145 == '\x02') {
    local_145 = logFloor<10ul,unsigned_char>(0xff);
    local_144 = 2;
    if (local_145 == '\x02') {
      return;
    }
    stringify<unsigned_char>(&local_a0,&local_145);
    std::operator+(&local_120,
                   "Comparison failed: log10floor<std::uint8_t>(255u) == 2u (with \"log10floor<std::uint8_t>(255u)\"="
                   ,&local_a0);
    std::operator+(&local_100,&local_120,", \"2u\"=");
    stringify<unsigned_int>(&local_c0,&local_144);
    std::operator+(&local_e0,&local_100,&local_c0);
    std::operator+(&local_140,&local_e0,")");
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_78 = "run";
    local_70 = 0x69;
    loc_03.function = "run";
    loc_03.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc_03.line = 0x69;
    msg_03._M_str = local_140._M_dataplus._M_p;
    msg_03._M_len = local_140._M_string_length;
    assertFail(msg_03,loc_03);
  }
  stringify<unsigned_char>(&local_a0,&local_145);
  std::operator+(&local_120,
                 "Comparison failed: log10floor<std::uint8_t>(100u) == 2u (with \"log10floor<std::uint8_t>(100u)\"="
                 ,&local_a0);
  std::operator+(&local_100,&local_120,", \"2u\"=");
  stringify<unsigned_int>(&local_c0,&local_144);
  std::operator+(&local_e0,&local_100,&local_c0);
  std::operator+(&local_140,&local_e0,")");
  local_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  pcStack_60 = "run";
  local_58 = 0x68;
  loc_02.function = "run";
  loc_02.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc_02.line = 0x68;
  msg_02._M_str = local_140._M_dataplus._M_p;
  msg_02._M_len = local_140._M_string_length;
  assertFail(msg_02,loc_02);
}

Assistant:

BITMANIP_TEST(intlog, log10floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint8_t>(255u), 2u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(3u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(5u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(6u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(7u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(8u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(11u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(12u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(13u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(14u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(15u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(16u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99u), 1u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999u), 2u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999u), 3u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10000u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999u), 4u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999u), 5u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(9'999'999u), 6u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(10'000'000u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(99'999'999u), 7u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(100'000'000u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(999'999'999u), 8u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(1'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(2'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(4'000'000'000u), 9u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint32_t>(std::uint32_t(~0)), 9u);

    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(std::uint64_t{1} << 63), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(9'999'999'999'999'999'999ull), 18u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(10'000'000'000'000'000'000ull), 19u);
    BITMANIP_STATIC_ASSERT_EQ(log10floor<std::uint64_t>(~std::uint64_t{0}), 19u);
}